

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O2

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::Denamespace
          (string *__return_storage_ptr__,NimBfbsGenerator *this,string *s,string *importns,
          string *ns)

{
  size_type sVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  const_iterator cVar2;
  char local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(anonymous_namespace)::builtin_types_abi_cxx11_,s);
  if (cVar2._M_node == (_Base_ptr)((anonymous_namespace)::builtin_types_abi_cxx11_ + 8)) {
    Namer::Denamespace(&local_70,&(this->namer_).super_Namer,s,ns,'.');
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (__return_storage_ptr__,&this->namer_,&local_70,
               (ulong)(this->namer_).super_Namer.config_.types);
    std::__cxx11::string::~string((string *)&local_70);
    sVar1 = ns->_M_string_length;
    if (sVar1 == 0) {
      std::__cxx11::string::string((string *)&local_70,(string *)__return_storage_ptr__);
    }
    else {
      std::operator+(&local_50,ns,".");
      std::operator+(&local_70,&local_50,__return_storage_ptr__);
    }
    std::__cxx11::string::operator=((string *)importns,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (sVar1 != 0) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    __first._M_current = (importns->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p._0_1_ = 0x2e;
    local_71 = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + importns->_M_string_length),(char *)&local_70,
               &local_71);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Denamespace(const std::string &s, std::string &importns,
                          std::string &ns) const {
    if (builtin_types.find(s) != builtin_types.end()) { return s; }
    std::string type = namer_.Type(namer_.Denamespace(s, ns));
    importns = ns.empty() ? type : ns + "." + type;
    std::replace(importns.begin(), importns.end(), '.', '_');
    return type;
  }